

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# spxfastrt.hpp
# Opt level: O2

bool __thiscall
soplex::SPxFastRT<double>::minReLeave
          (SPxFastRT<double> *this,double *sel,int leave,double maxabs,bool polish)

{
  double *pdVar1;
  double dVar2;
  UpdateVector<double> *pUVar3;
  Status SVar4;
  SPxSolverBase<double> *pSVar5;
  double dVar6;
  
  if (leave < 0) goto LAB_002060d9;
  pSVar5 = (this->super_SPxRatioTester<double>).thesolver;
  pUVar3 = pSVar5->theFvec;
  dVar6 = (pSVar5->theUBbound).val.super__Vector_base<double,_std::allocator<double>_>._M_impl.
          super__Vector_impl_data._M_start[(uint)leave];
  pdVar1 = (pSVar5->theLBbound).val.super__Vector_base<double,_std::allocator<double>_>._M_impl.
           super__Vector_impl_data._M_start + (uint)leave;
  if (dVar6 < *pdVar1 || dVar6 == *pdVar1) {
    *sel = 0.0;
    if (polish) goto LAB_002060d9;
    SPxSolverBase<double>::shiftLBbound
              (pSVar5,leave,
               (pUVar3->super_VectorBase<double>).val.
               super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
               _M_start[(uint)leave]);
    pSVar5 = (this->super_SPxRatioTester<double>).thesolver;
    dVar6 = (pUVar3->super_VectorBase<double>).val.
            super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
            _M_start[(uint)leave];
  }
  else {
    if (*sel <= this->fastDelta / maxabs) goto LAB_002060d9;
    dVar2 = (pUVar3->thedelta).super_VectorBase<double>.val.
            super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
            _M_start[(uint)leave];
    *sel = 0.0;
    if (polish) goto LAB_002060d9;
    SVar4 = SPxBasisBase<double>::dualStatus
                      (&pSVar5->super_SPxBasisBase<double>,
                       (pSVar5->super_SPxBasisBase<double>).theBaseId.data + (uint)leave);
    if (SVar4 == D_ON_BOTH) goto LAB_002060d9;
    pSVar5 = (this->super_SPxRatioTester<double>).thesolver;
    dVar6 = (pUVar3->super_VectorBase<double>).val.
            super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
            _M_start[(uint)leave];
    if (0.0 < dVar2) {
      SPxSolverBase<double>::shiftLBbound(pSVar5,leave,dVar6);
      goto LAB_002060d9;
    }
  }
  SPxSolverBase<double>::shiftUBbound(pSVar5,leave,dVar6);
LAB_002060d9:
  return SUB41((uint)leave >> 0x1f,0);
}

Assistant:

bool SPxFastRT<R>::minReLeave(R& sel, int leave, R maxabs, bool polish)
{
   UpdateVector<R>& vec = this->thesolver->fVec();
   VectorBase<R>& low = this->thesolver->lbBound();
   VectorBase<R>& up = this->thesolver->ubBound();

   if(leave < 0)
      return true;

   if(up[leave] > low[leave])
   {
      R x = vec.delta()[leave];

      if(sel > fastDelta / maxabs)
      {
         sel = 0.0;

         if(!polish
               && this->thesolver->dualStatus(this->thesolver->baseId(leave)) != SPxBasisBase<R>::Desc::D_ON_BOTH)
            // prevent shifts in polishing mode to avoid a final cleanup step (i.e. simplex type switch)
         {
            if(x > 0.0)
               this->thesolver->shiftLBbound(leave, vec[leave]);
            else
               this->thesolver->shiftUBbound(leave, vec[leave]);
         }
      }
   }
   else
   {
      sel = 0.0;

      // prevent shifts in polishing mode to avoid a final cleanup step (i.e. simplex type switch)
      if(!polish)
      {
         this->thesolver->shiftLBbound(leave, vec[leave]);
         this->thesolver->shiftUBbound(leave, vec[leave]);
      }
   }

   return false;
}